

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void prvTidyDeclareListItem(TidyDocImpl *doc,TidyOptionImpl *opt,ctmbstr name)

{
  TidyOptionId TVar1;
  ctmbstr str;
  uint uVar2;
  uint uVar3;
  ctmbstr ptStack_38;
  uint len;
  ctmbstr theval;
  tmbstr catval;
  ctmbstr prvval;
  ctmbstr name_local;
  TidyOptionImpl *opt_local;
  TidyDocImpl *doc_local;
  
  str = (doc->config).value[opt->id].p;
  theval = (ctmbstr)0x0;
  ptStack_38 = name;
  if (str != (ctmbstr)0x0) {
    uVar2 = prvTidytmbstrlen(name);
    uVar3 = prvTidytmbstrlen(str);
    ptStack_38 = prvTidytmbstrndup(doc->allocator,str,uVar2 + uVar3 + 3);
    prvTidytmbstrcat(ptStack_38,", ");
    prvTidytmbstrcat(ptStack_38,name);
    theval = ptStack_38;
  }
  TVar1 = opt->id;
  if ((((TVar1 != TidyBlockTags) && (TVar1 != TidyCustomTags)) && (TVar1 != TidyEmptyTags)) &&
     (TVar1 != TidyInlineTags)) {
    if (TVar1 == TidyMuteReports) {
      prvTidyDefineMutedMessage(doc,opt,name);
      goto LAB_00168d13;
    }
    if (TVar1 != TidyPreTags) {
      if (TVar1 == TidyPriorityAttributes) {
        prvTidyDefinePriorityAttribute(doc,name);
      }
      goto LAB_00168d13;
    }
  }
  prvTidyDeclareUserTag(doc,opt,name);
LAB_00168d13:
  SetOptionValue(doc,opt->id,ptStack_38);
  if (theval != (ctmbstr)0x0) {
    (*doc->allocator->vtbl->free)(doc->allocator,theval);
  }
  return;
}

Assistant:

void TY_(DeclareListItem)( TidyDocImpl* doc, const TidyOptionImpl* opt, ctmbstr name )
{
    ctmbstr prvval = cfgStr( doc, opt->id );
    tmbstr catval = NULL;
    ctmbstr theval = name;
    if ( prvval )
    {
        uint len = TY_(tmbstrlen)(name) + TY_(tmbstrlen)(prvval) + 3;
        catval = TY_(tmbstrndup)( doc->allocator, prvval, len );
        TY_(tmbstrcat)( catval, ", " );
        TY_(tmbstrcat)( catval, name );
        theval = catval;
    }

    switch ( opt->id )
    {
        case TidyPriorityAttributes:
            TY_(DefinePriorityAttribute)( doc, name );
            break;

        case TidyMuteReports:
            TY_(DefineMutedMessage)( doc, opt, name );
            break;

        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        case TidyCustomTags:
            TY_(DeclareUserTag)( doc, opt, name );
            break;

        default:
            break;
    }

    SetOptionValue( doc, opt->id, theval );
    if ( catval )
        TidyDocFree( doc, catval );
}